

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O1

uint32_t readUint32InBigEndian(void *memory)

{
  uint uVar1;
  
  uVar1 = *memory;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

uint32_t readUint32InBigEndian(void* memory)
{
	uint8_t* p = memory;
	return (((uint32_t)p[0]) << 24) | 
		   (((uint32_t)p[1]) << 16) |
		   (((uint32_t)p[2]) <<  8) |
		   (((uint32_t)p[3]));
}